

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Station.cpp
# Opt level: O3

void __thiscall imrt::Station::clearHistory(Station *this)

{
  list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *plVar1;
  _List_node_base *p_Var2;
  pointer pdVar3;
  _List_node_base *p_Var4;
  
  plVar1 = &this->last_diff;
  (this->last_mem).first.first = -1;
  (this->last_mem).first.second = -1;
  (this->last_mem).second.first = -1;
  (this->last_mem).second.second = -1;
  p_Var4 = (this->last_diff).
           super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
           _M_impl._M_node.super__List_node_base._M_next;
  while (p_Var4 != (_List_node_base *)plVar1) {
    p_Var2 = p_Var4->_M_next;
    operator_delete(p_Var4);
    p_Var4 = p_Var2;
  }
  (this->last_diff).
  super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl._M_node
  .super__List_node_base._M_prev = (_List_node_base *)plVar1;
  (this->last_diff).
  super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl._M_node
  .super__List_node_base._M_next = (_List_node_base *)plVar1;
  (this->last_diff).
  super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl._M_node
  ._M_size = 0;
  pdVar3 = (this->last_intensity).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->last_intensity).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar3) {
    (this->last_intensity).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = pdVar3;
  }
  return;
}

Assistant:

void Station::clearHistory() {
    last_mem= make_pair(make_pair(-1,-1), make_pair(-1,-1));
    last_diff.clear();
    last_intensity.clear();
  }